

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

bool __thiscall
MinVR::VRDataIndex::linkNode
          (VRDataIndex *this,string *fullSourceName,string *fullTargetName,int depthLimit)

{
  _Rb_tree_header *p_Var1;
  VRDatum_conflict *this_00;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  undefined4 extraout_var;
  VRError *pVVar6;
  _Self __tmp;
  _List_node_base *p_Var7;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string *local_1d0;
  int local_1c4;
  VRDatumPtr sourceNode;
  int local_1ac;
  string fixTargetName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  local_188;
  VRContainer childrenToCopy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  VRDataIndex *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1d0 = fullSourceName;
  local_1c4 = depthLimit;
  if (7 < depthLimit) {
    pVVar6 = (VRError *)__cxa_allocate_exception(0xa8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Too deep a recursion.",(allocator<char> *)&childrenToCopy);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fixTargetName,"Did you set up a circular reference?",
               (allocator<char> *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
               ,(allocator<char> *)&local_d0);
    local_f8._M_dataplus._M_p._0_4_ = 0x503;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,
               "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)",
               (allocator<char> *)&sourceNode);
    VRError::VRError(pVVar6,&local_188.first,&fixTargetName,&local_118,(int *)&local_f8,&local_138);
    __cxa_throw(pVVar6,&VRError::typeinfo,VRError::~VRError);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_188);
  iVar4 = _getEntry(this,local_1d0,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    if (*(fullTargetName->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::string((string *)&fixTargetName,(string *)fullTargetName);
    }
    else {
      std::operator+(&fixTargetName,"/",fullTargetName);
    }
    sourceNode.pData = *(VRDatum_conflict **)(iVar4._M_node + 2);
    sourceNode.reference = (VRDatumPtrRC *)iVar4._M_node[2]._M_parent;
    ((_Base_ptr)sourceNode.reference)->_M_color =
         ((_Base_ptr)sourceNode.reference)->_M_color + _S_black;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_188);
    iVar4 = _getEntry(this,&fixTargetName,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MinVR::VRDatumPtr_&,_true>
                (&local_188,&fixTargetName,&sourceNode);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
                  *)this,&local_188);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
      ::~pair(&local_188);
    }
    else {
      VRDatumPtr::operator=((VRDatumPtr *)(iVar4._M_node + 2),&sourceNode);
    }
    this_00 = sourceNode.pData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"linkContent",(allocator<char> *)&local_188);
    bVar2 = VRDatum::hasAttribute((VRDatum *)this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar2) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->_linkRegister,local_1d0);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((sourceNode.pData)->type == VRCORETYPE_CONTAINER) {
        iVar3 = (*(sourceNode.pData)->_vptr_VRDatum[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x88))
                  ((_List_node_base *)&childrenToCopy,(long *)CONCAT44(extraout_var,iVar3));
        if (childrenToCopy.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&childrenToCopy) {
          local_1c4 = local_1c4 + 1;
          local_d8 = this;
          for (p_Var7 = childrenToCopy.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              p_Var7 != (_List_node_base *)&childrenToCopy;
              p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
            std::operator+(&local_118,local_1d0,"/");
            std::operator+(&local_188.first,&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var7 + 1));
            std::operator+(&local_f8,&fixTargetName,"/");
            std::operator+(&local_138,&local_f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var7 + 1));
            linkNode(local_d8,&local_188.first,&local_138,local_1c4);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_118);
          }
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&childrenToCopy.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
      }
      VRDatumPtr::~VRDatumPtr(&sourceNode);
      std::__cxx11::string::~string((string *)&fixTargetName);
      return true;
    }
    pVVar6 = (VRError *)__cxa_allocate_exception(0xa8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Linking content and nodes not allowed.",&local_1d1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &childrenToCopy,
                   "You really don\'t want to mix linkContent and linkNode, as in linking ",
                   local_1d0);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &childrenToCopy," and ");
    std::operator+(&local_138,&local_f8,&fixTargetName);
    std::operator+(&local_118,&local_138,".");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
               ,&local_1d2);
    local_1ac = 0x522;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)",
               &local_1d3);
    VRError::VRError(pVVar6,&local_188.first,&local_118,&local_b0,&local_1ac,&local_d0);
    __cxa_throw(pVVar6,&VRError::typeinfo,VRError::~VRError);
  }
  pVVar6 = (VRError *)__cxa_allocate_exception(0xa8);
  std::operator+(&local_188.first,"Can\'t find the source node: ",local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fixTargetName,"",(allocator<char> *)&childrenToCopy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
             ,(allocator<char> *)&local_b0);
  local_f8._M_dataplus._M_p._0_4_ = 0x508;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)",
             (allocator<char> *)&local_d0);
  VRError::VRError(pVVar6,&local_188.first,&fixTargetName,&local_118,(int *)&local_f8,&local_138);
  __cxa_throw(pVVar6,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

bool VRDataIndex::linkNode(const std::string &fullSourceName,
                           const std::string &fullTargetName,
                           int depthLimit) {

  // This is an easy way to make a disaster, so we have a recursion
  // limit.  It's possible this should be adjustable, but not sure of
  // a use case where the plausible depthLimit would exceed 10.
  if (depthLimit > 7)
    VRERROR("Too deep a recursion.", "Did you set up a circular reference?");

  // Find source node, fail if it does not exist.
  VRDataMap::iterator sourceEntry = _getEntry(fullSourceName);
  if (sourceEntry == _theIndex.end())
    VRERRORNOADV("Can't find the source node: " + fullSourceName);

  // It's possible the target name won't start with a '/', in which
  // case, stick one on front.
  std::string fixTargetName =
    (fullTargetName[0] == '/') ? fullTargetName : "/" + fullTargetName;

  
  VRDatumPtr sourceNode = sourceEntry->second;
  VRDataMap::iterator targetEntry = _getEntry(fixTargetName);

  // Does this name already exist?
  if (targetEntry != _theIndex.end()) {

    // Yes.  Make the copy.
    targetEntry->second = sourceNode;
  } else {

    // No. Make an entry in the index, linked to the sourceNode.
    _theIndex.insert(VRDataMap::value_type(fixTargetName, sourceNode));

  }

  if (sourceNode->hasAttribute("linkContent"))
    VRERROR("Linking content and nodes not allowed.",
            "You really don't want to mix linkContent and linkNode, as in linking " +
            fullSourceName + " and " + fixTargetName + ".");

  // Record the link we made.  This is for use by the copy constructor.
  _linkRegister[fullSourceName] = fixTargetName;

  // If this is a container, recurse into the children, and copy them, too.
  if (sourceNode->getType() == VRCORETYPE_CONTAINER) {

    VRContainer childrenToCopy = sourceNode->getValue();

    // If there are no children, go home.
    if (childrenToCopy.empty()) return true;

    // Otherwise copy them, too.
    for (VRContainer::iterator jt = childrenToCopy.begin();
         jt != childrenToCopy.end(); jt++)
      linkNode(fullSourceName + "/" + *jt,
               fixTargetName + "/" + *jt,
               depthLimit + 1);
  }
  return true;
}